

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionarydata.cpp
# Opt level: O0

UChar32 __thiscall icu_63::BytesDictionaryMatcher::transform(BytesDictionaryMatcher *this,UChar32 c)

{
  int32_t delta;
  UChar32 c_local;
  BytesDictionaryMatcher *this_local;
  
  this_local._4_4_ = c;
  if ((this->transformConstant & 0x7f000000U) == 0x1000000) {
    if (c == 0x200d) {
      this_local._4_4_ = 0xff;
    }
    else if (c == 0x200c) {
      this_local._4_4_ = 0xfe;
    }
    else {
      this_local._4_4_ = c - (this->transformConstant & 0x1fffffU);
      if ((this_local._4_4_ < 0) || (0xfd < this_local._4_4_)) {
        this_local._4_4_ = -1;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

UChar32 BytesDictionaryMatcher::transform(UChar32 c) const {
    if ((transformConstant & DictionaryData::TRANSFORM_TYPE_MASK) == DictionaryData::TRANSFORM_TYPE_OFFSET) {
        if (c == 0x200D) {
            return 0xFF;
        } else if (c == 0x200C) {
            return 0xFE;
        }
        int32_t delta = c - (transformConstant & DictionaryData::TRANSFORM_OFFSET_MASK);
        if (delta < 0 || 0xFD < delta) {
            return U_SENTINEL;
        }
        return (UChar32)delta;
    }
    return c;
}